

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ranges.h
# Opt level: O2

iterator __thiscall
fmt::v6::formatter<std::vector<int,std::allocator<int>>,char,void>::
format<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
          (formatter<std::vector<int,std::allocator<int>>,char,void> *this,
          vector<int,_std::allocator<int>_> *values,
          basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>
          *ctx)

{
  int *args;
  pointer piVar1;
  int *piVar2;
  char *in_RAX;
  back_insert_iterator<fmt::v6::internal::buffer<char>_> bVar3;
  long lVar4;
  char *local_38;
  
  local_38 = in_RAX;
  bVar3 = internal::copy<std::back_insert_iterator<fmt::v6::internal::buffer<char>>>
                    ((char)*this,(ctx->out_).container);
  piVar1 = (values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar2 = (values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  lVar4 = 0;
  do {
    args = (int *)((long)piVar1 + lVar4);
    if (args == piVar2) goto LAB_00128810;
    if (lVar4 == 0) {
      local_38 = "{}";
    }
    else {
      bVar3 = internal::copy<std::back_insert_iterator<fmt::v6::internal::buffer<char>>>
                        ((char)this[1],bVar3);
      local_38 = " {}";
    }
    bVar3 = format_to<fmt::v6::internal::buffer<char>,_const_char_*,_const_int_&,_0>
                      (bVar3,&local_38,args);
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x404);
  bVar3 = format_to<fmt::v6::internal::buffer<char>,_char[22],_0>
                    (bVar3,(char (*) [22])" ... <other elements>");
LAB_00128810:
  bVar3 = internal::copy<std::back_insert_iterator<fmt::v6::internal::buffer<char>>>
                    ((char)this[2],bVar3);
  return (iterator)bVar3.container;
}

Assistant:

typename FormatContext::iterator format(const RangeT& values,
                                          FormatContext& ctx) {
    auto out = internal::copy(formatting.prefix, ctx.out());
    std::size_t i = 0;
    for (auto it = values.begin(), end = values.end(); it != end; ++it) {
      if (i > 0) {
        if (formatting.add_prepostfix_space) *out++ = ' ';
        out = internal::copy(formatting.delimiter, out);
      }
      out = format_to(out,
                      internal::format_str_quoted(
                          (formatting.add_delimiter_spaces && i > 0), *it),
                      *it);
      if (++i > formatting.range_length_limit) {
        out = format_to(out, " ... <other elements>");
        break;
      }
    }
    if (formatting.add_prepostfix_space) *out++ = ' ';
    return internal::copy(formatting.postfix, out);
  }